

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void inithess_naive(double *H,int N,double fi,double fsval,double *dx)

{
  double local_48;
  double temp;
  int local_38;
  int ct;
  int j;
  int i;
  double *dx_local;
  double fsval_local;
  double fi_local;
  int N_local;
  double *H_local;
  
  local_48 = fsval;
  if (fsval < ABS(fi)) {
    local_48 = ABS(fi);
  }
  for (ct = 0; ct < N; ct = ct + 1) {
    for (local_38 = 0; local_38 < N; local_38 = local_38 + 1) {
      if (ct == local_38) {
        H[ct * N + local_38] = local_48 * dx[ct] * dx[ct];
      }
      else {
        H[ct * N + local_38] = 0.0;
      }
    }
  }
  return;
}

Assistant:

static void inithess_naive(double *H,int N,double fi,double fsval,double *dx) {
	int i,j,ct;
	double temp;
	
	if (fabs(fi) > fsval) {
		temp = fabs(fi);
	} else {
		temp = fsval;
	}
	
	for(i = 0; i < N;++i) {
		ct = i *N;
		for(j = 0; j < N;++j) {
			if (i == j) {
				H[ct+j] = temp * dx[i] * dx[i];
			} else {
				H[ct+j] = 0.0;
			}
			
		}
	}
	
}